

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O0

MPP_RET vpu_api_set_enc_cfg(MppCtx mpp_ctx,MppApi *mpi,MppEncCfg enc_cfg,MppCodingType coding,
                           MppFrameFormat fmt,EncParameter_t *cfg)

{
  int iVar1;
  int iVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  int iVar7;
  MppFrameFormat MVar8;
  MPP_RET MVar9;
  bool bVar10;
  undefined1 uVar11;
  int local_e4;
  int local_d4;
  int local_c4;
  int local_ac;
  char *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  RK_S32 local_70;
  RK_S32 local_6c;
  RK_U32 is_fix_qp;
  RK_S32 rc_mode;
  RK_S32 cabac_en;
  RK_S32 level;
  RK_S32 profile;
  RK_S32 qp;
  RK_S32 qp_init;
  RK_S32 gop;
  RK_S32 fps_out;
  RK_S32 fps_in;
  RK_S32 bps;
  RK_S32 height;
  RK_S32 width;
  MPP_RET ret;
  EncParameter_t *cfg_local;
  MppFrameFormat fmt_local;
  MppCodingType coding_local;
  MppEncCfg enc_cfg_local;
  MppApi *mpi_local;
  MppCtx mpp_ctx_local;
  
  iVar1 = cfg->width;
  iVar2 = cfg->height;
  local_ac = cfg->bitRate;
  RVar3 = cfg->framerate;
  local_6c = RVar3;
  if (cfg->framerateout != 0) {
    local_6c = cfg->framerateout;
  }
  if (cfg->intraPicRate == 0) {
    local_70 = local_6c;
  }
  else {
    local_70 = cfg->intraPicRate;
  }
  if (coding == MPP_VIDEO_CodingAVC) {
    local_74 = 0x1a;
  }
  else {
    if (coding == MPP_VIDEO_CodingMJPEG) {
      local_78 = 10;
    }
    else {
      if (coding == MPP_VIDEO_CodingVP8) {
        local_7c = 0x38;
      }
      else {
        local_7c = 0;
        if (coding == MPP_VIDEO_CodingHEVC) {
          local_7c = 0x1a;
        }
      }
      local_78 = local_7c;
    }
    local_74 = local_78;
  }
  if (cfg->qp == 0) {
    local_80 = local_74;
  }
  else {
    local_80 = cfg->qp;
  }
  RVar4 = cfg->profileIdc;
  RVar5 = cfg->levelIdc;
  RVar6 = cfg->enableCabac;
  iVar7 = cfg->rc_mode;
  bVar10 = iVar7 != 2;
  _mpp_log_l(4,"vpu_api_legacy","setup encoder rate control config:\n",0);
  MVar8 = fmt;
  _mpp_log_l(4,"vpu_api_legacy","width %4d height %4d format %d:%x\n",0,iVar1,iVar2,cfg->format,fmt)
  ;
  if (iVar7 == 0) {
    local_88 = "CQP";
  }
  else {
    local_88 = "CBR";
  }
  _mpp_log_l(4,"vpu_api_legacy","rc_mode %s qp %d bps %d\n",0,local_88,local_80,local_ac,MVar8);
  _mpp_log_l(4,"vpu_api_legacy","fps in %d fps out %d gop %d\n",0,RVar3,local_6c,local_70);
  _mpp_log_l(4,"vpu_api_legacy","setup encoder stream feature config:\n",0);
  _mpp_log_l(4,"vpu_api_legacy","profile %d level %d cabac %d\n",0,RVar4,RVar5,RVar6);
  if ((iVar1 == 0) &&
     (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"width","vpu_api_set_enc_cfg"
                 ,0x7a), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((iVar2 == 0) &&
     (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"height",
                 "vpu_api_set_enc_cfg",0x7b), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((local_80 == 0) &&
     (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"qp","vpu_api_set_enc_cfg",
                 0x7c), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  mpp_enc_cfg_set_s32(enc_cfg,"prep:width",iVar1);
  mpp_enc_cfg_set_s32(enc_cfg,"prep:height",iVar2);
  MVar8 = fmt & 0xfffff;
  if ((MVar8 == MPP_FMT_YUV420SP) || (MVar8 - MPP_FMT_YUV420P < 2)) {
    mpp_enc_cfg_set_s32(enc_cfg,"prep:hor_stride",iVar1 + 0xfU & 0xfffffff0);
  }
  else if (MVar8 - MPP_FMT_RGB565 < 4) {
    mpp_enc_cfg_set_s32(enc_cfg,"prep:hor_stride",(iVar1 + 0xfU & 0xfffffff0) << 1);
  }
  else if (MVar8 - MPP_FMT_RGB888 < 2) {
    mpp_enc_cfg_set_s32(enc_cfg,"prep:hor_stride",(iVar1 + 0xfU & 0xfffffff0) * 3);
  }
  else if (MVar8 - MPP_FMT_ARGB8888 < 4) {
    mpp_enc_cfg_set_s32(enc_cfg,"prep:hor_stride",(iVar1 + 0xfU & 0xfffffff0) << 2);
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","unsupport format 0x%x\n",0,fmt & 0xfffff);
  }
  mpp_enc_cfg_set_s32(enc_cfg,"prep:ver_stride",iVar2 + 7U & 0xfffffff8);
  mpp_enc_cfg_set_s32(enc_cfg,"prep:format",fmt);
  if (bVar10) {
    uVar11 = iVar7 != 0;
  }
  else {
    uVar11 = 2;
  }
  mpp_enc_cfg_set_s32(enc_cfg,"rc:mode",uVar11);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:bps_target",local_ac);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:bps_max",(long)(local_ac * 0x11) / 0x10 & 0xffffffff);
  if (iVar7 != 0) {
    local_ac = local_ac * 0xf;
  }
  local_ac = local_ac / 0x10;
  mpp_enc_cfg_set_s32(enc_cfg,"rc:bps_min",local_ac);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_in_flex");
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_in_num",RVar3);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_in_denom");
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_out_flex",0);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_out_num",local_6c);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_out_denom",1);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:gop",local_70);
  mpp_enc_cfg_set_s32(enc_cfg,"codec:type",coding);
  if (coding == MPP_VIDEO_CodingAVC) {
    mpp_enc_cfg_set_s32(enc_cfg,"h264:profile",RVar4);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:level",RVar5);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:cabac_en",RVar6);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:cabac_idc",0);
    if (bVar10) {
      local_c4 = -1;
    }
    else {
      local_c4 = local_80;
    }
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_init",local_c4);
    if (bVar10) {
      local_d4 = 10;
    }
    else {
      local_d4 = local_80;
    }
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_min",local_d4);
    if (bVar10) {
      local_e4 = 0x33;
    }
    else {
      local_e4 = local_80;
    }
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_max",local_e4);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_min_i",10);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_max_i",0x33);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_step",4);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_delta_ip",3);
  }
  else if (coding == MPP_VIDEO_CodingMJPEG) {
    mpp_enc_cfg_set_s32(enc_cfg,"jpeg:quant",local_80);
  }
  else if (coding == MPP_VIDEO_CodingVP8) {
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_init",0xffffffff);
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_min",0);
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_max",0x7f);
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_min_i",0);
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_max_i",0x7f);
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","support encoder coding type %d\n","vpu_api_set_enc_cfg",coding);
  }
  MVar9 = (*mpi->control)(mpp_ctx,MPP_ENC_SET_CFG,enc_cfg);
  if (MVar9 != MPP_OK) {
    _mpp_log_l(2,"vpu_api_legacy","setup enc config failed ret %d\n",0,MVar9);
  }
  return MVar9;
}

Assistant:

static MPP_RET vpu_api_set_enc_cfg(MppCtx mpp_ctx, MppApi *mpi, MppEncCfg enc_cfg,
                                   MppCodingType coding, MppFrameFormat fmt,
                                   EncParameter_t *cfg)
{
    MPP_RET ret = MPP_OK;
    RK_S32 width    = cfg->width;
    RK_S32 height   = cfg->height;
    RK_S32 bps      = cfg->bitRate;
    RK_S32 fps_in   = cfg->framerate;
    RK_S32 fps_out  = (cfg->framerateout) ? (cfg->framerateout) : (fps_in);
    RK_S32 gop      = (cfg->intraPicRate) ? (cfg->intraPicRate) : (fps_out);
    RK_S32 qp_init  = (coding == MPP_VIDEO_CodingAVC) ? (26) :
                      (coding == MPP_VIDEO_CodingMJPEG) ? (10) :
                      (coding == MPP_VIDEO_CodingVP8) ? (56) :
                      (coding == MPP_VIDEO_CodingHEVC) ? (26) : (0);
    RK_S32 qp       = (cfg->qp) ? (cfg->qp) : (qp_init);
    RK_S32 profile  = cfg->profileIdc;
    RK_S32 level    = cfg->levelIdc;
    RK_S32 cabac_en = cfg->enableCabac;
    RK_S32 rc_mode  = cfg->rc_mode;
    RK_U32 is_fix_qp = (rc_mode == MPP_ENC_RC_MODE_FIXQP) ? 1 : 0;

    mpp_log("setup encoder rate control config:\n");
    mpp_log("width %4d height %4d format %d:%x\n", width, height, cfg->format, fmt);
    mpp_log("rc_mode %s qp %d bps %d\n", (rc_mode) ? ("CBR") : ("CQP"), qp, bps);
    mpp_log("fps in %d fps out %d gop %d\n", fps_in, fps_out, gop);
    mpp_log("setup encoder stream feature config:\n");
    mpp_log("profile %d level %d cabac %d\n", profile, level, cabac_en);

    mpp_assert(width);
    mpp_assert(height);
    mpp_assert(qp);

    mpp_enc_cfg_set_s32(enc_cfg, "prep:width", width);
    mpp_enc_cfg_set_s32(enc_cfg, "prep:height", height);
    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420P:
    case MPP_FMT_YUV420SP :
    case MPP_FMT_YUV420SP_VU : {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", MPP_ALIGN(width, 16));
    } break;
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555: {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", 2 * MPP_ALIGN(width, 16));
    } break;
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", 3 * MPP_ALIGN(width, 16));
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", 4 * MPP_ALIGN(width, 16));
    } break;
    default: {
        mpp_err("unsupport format 0x%x\n", fmt & MPP_FRAME_FMT_MASK);
    } break;
    }
    mpp_enc_cfg_set_s32(enc_cfg, "prep:ver_stride", MPP_ALIGN(height, 8));
    mpp_enc_cfg_set_s32(enc_cfg, "prep:format", fmt);

    mpp_enc_cfg_set_s32(enc_cfg, "rc:mode", is_fix_qp ? MPP_ENC_RC_MODE_FIXQP :
                        (rc_mode ? MPP_ENC_RC_MODE_CBR : MPP_ENC_RC_MODE_VBR));
    mpp_enc_cfg_set_s32(enc_cfg, "rc:bps_target", bps);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:bps_max", bps * 17 / 16);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:bps_min", rc_mode ? bps * 15 / 16 : bps * 1 / 16);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_in_flex", 0);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_in_num", fps_in);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_in_denom", 1);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_out_flex", 0);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_out_num", fps_out);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_out_denom", 1);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:gop", gop);

    mpp_enc_cfg_set_s32(enc_cfg, "codec:type", coding);
    switch (coding) {
    case MPP_VIDEO_CodingAVC : {
        mpp_enc_cfg_set_s32(enc_cfg, "h264:profile", profile);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:level", level);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:cabac_en", cabac_en);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:cabac_idc", 0);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_init", is_fix_qp ? qp : -1);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_min", is_fix_qp  ? qp : 10);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_max", is_fix_qp ? qp : 51);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_min_i", 10);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_max_i", 51);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_step", 4);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_delta_ip", 3);
    } break;
    case MPP_VIDEO_CodingVP8 : {
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_init", -1);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_min", 0);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_max", 127);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_min_i", 0);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_max_i", 127);
    } break;
    case MPP_VIDEO_CodingMJPEG : {
        mpp_enc_cfg_set_s32(enc_cfg, "jpeg:quant", qp);
    } break;
    default : {
        mpp_err_f("support encoder coding type %d\n", coding);
    } break;
    }

    ret = mpi->control(mpp_ctx, MPP_ENC_SET_CFG, enc_cfg);
    if (ret) {
        mpp_err("setup enc config failed ret %d\n", ret);
        goto RET;
    }
RET:
    return ret;
}